

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

mtree_entry_conflict * mtree_entry_find_child(mtree_entry_conflict *parent,char *child_name)

{
  void *in_RDI;
  mtree_entry_conflict *np;
  archive_rb_tree *in_stack_fffffffffffffff8;
  mtree_entry_conflict *pmVar1;
  
  if (in_RDI == (void *)0x0) {
    pmVar1 = (mtree_entry_conflict *)0x0;
  }
  else {
    pmVar1 = (mtree_entry_conflict *)__archive_rb_tree_find_node(in_stack_fffffffffffffff8,in_RDI);
  }
  return pmVar1;
}

Assistant:

static struct mtree_entry *
mtree_entry_find_child(struct mtree_entry *parent, const char *child_name)
{
	struct mtree_entry *np;

	if (parent == NULL)
		return (NULL);
	np = (struct mtree_entry *)__archive_rb_tree_find_node(
	    &(parent->dir_info->rbtree), child_name);
	return (np);
}